

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<QAbstractEventDispatcher::TimerInfoV2>::relocate
          (QArrayDataPointer<QAbstractEventDispatcher::TimerInfoV2> *this,qsizetype offset,
          TimerInfoV2 **data)

{
  TimerInfoV2 *d_first;
  TimerInfoV2 *pTVar1;
  
  d_first = this->ptr + offset;
  QtPrivate::q_relocate_overlap_n<QAbstractEventDispatcher::TimerInfoV2,long_long>
            (this->ptr,this->size,d_first);
  if (data != (TimerInfoV2 **)0x0) {
    pTVar1 = *data;
    if ((this->ptr <= pTVar1) && (pTVar1 < this->ptr + this->size)) {
      *data = pTVar1 + offset;
    }
  }
  this->ptr = d_first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }